

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

int Fl_Text_Editor::kf_select_all(int param_1,Fl_Text_Editor *e)

{
  Fl_Text_Buffer *this;
  EVP_PKEY_CTX *dst;
  size_t sVar1;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  
  this = (e->super_Fl_Text_Display).mBuffer;
  Fl_Text_Buffer::select(this,0,(fd_set *)(ulong)(uint)this->mLength,in_RCX,in_R8,in_R9);
  dst = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text((e->super_Fl_Text_Display).mBuffer);
  if (*dst != (EVP_PKEY_CTX)0x0) {
    sVar1 = strlen((char *)dst);
    Fl::copy(dst,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
  }
  free(dst);
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_select_all(int, Fl_Text_Editor* e) {
  e->buffer()->select(0, e->buffer()->length());
  const char *copy = e->buffer()->selection_text();
  if (*copy) Fl::copy(copy, (int) strlen(copy), 0);
  free((void*)copy);
  return 1;
}